

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrDownloadSharedSpatialAnchorAsyncBD
                   (XrSenseDataProviderBD provider,XrSharedSpatialAnchorDownloadInfoBD *info,
                   XrFutureEXT *future)

{
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  iterator iVar4;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table;
  XrSenseDataProviderBD provider_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  string local_338;
  ostringstream oss_future;
  uint auStack_300 [88];
  ostringstream oss_provider;
  uint auStack_188 [88];
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  provider_local = provider;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_provider,&g_sensedataproviderbd_dispatch_mutex);
  iVar4 = std::
          _Hashtable<XrSenseDataProviderBD_T_*,_std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrSenseDataProviderBD_T_*>,_std::hash<XrSenseDataProviderBD_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_sensedataproviderbd_dispatch_map._M_h,&provider_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    gen_dispatch_table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    gen_dispatch_table =
         *(XrGeneratedDispatchTable **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
                 ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_provider);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[37],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",
               (char (*) [37])"xrDownloadSharedSpatialAnchorAsyncBD",(char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_provider);
    lVar1 = *(long *)((long)&_oss_provider[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_188 + lVar1) = *(uint *)((long)auStack_188 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_provider);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[22],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [22])"XrSenseDataProviderBD",(char (*) [9])"provider",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_future);
    std::__cxx11::string::~string((string *)&oss_future);
    std::__cxx11::string::string((string *)&local_338,"info",(allocator *)&oss_future);
    std::__cxx11::string::string
              ((string *)&local_358,"const XrSharedSpatialAnchorDownloadInfoBD*",
               (allocator *)&local_378);
    bVar2 = ApiDumpOutputXrStruct(gen_dispatch_table,info,&local_338,&local_358,true,&contents);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_future);
    *(uint *)((long)auStack_300 + *(long *)(_oss_future + -0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(_oss_future + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_future);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[13],char_const(&)[7],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [13])"XrFutureEXT*",(char (*) [7])"future",&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_390,&contents);
    ApiDumpLayerRecordContent(&local_390);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_390);
    XVar3 = (*gen_dispatch_table->DownloadSharedSpatialAnchorAsyncBD)(provider_local,info,future);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_future);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_provider);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrDownloadSharedSpatialAnchorAsyncBD(
    XrSenseDataProviderBD provider,
    const XrSharedSpatialAnchorDownloadInfoBD* info,
    XrFutureEXT* future) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_sensedataproviderbd_dispatch_mutex);
            auto map_iter = g_sensedataproviderbd_dispatch_map.find(provider);
            if (map_iter == g_sensedataproviderbd_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrDownloadSharedSpatialAnchorAsyncBD", "");
        std::ostringstream oss_provider;
        oss_provider << std::hex << reinterpret_cast<const void*>(provider);
        contents.emplace_back("XrSenseDataProviderBD", "provider", oss_provider.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, info, "info", "const XrSharedSpatialAnchorDownloadInfoBD*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_future;
        oss_future << std::hex << reinterpret_cast<const void*>(future);
        contents.emplace_back("XrFutureEXT*", "future", oss_future.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->DownloadSharedSpatialAnchorAsyncBD(provider, info, future);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}